

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rvm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  undefined8 *in_RSI;
  int in_EDI;
  Mat pha;
  Mat fgr;
  Mat m;
  char *imagepath;
  undefined4 in_stack_00000194;
  Mat *in_stack_000002c0;
  Mat *in_stack_000002c8;
  Mat *in_stack_000002d0;
  Mat local_170 [96];
  Mat local_110 [96];
  undefined4 local_b0;
  allocator local_99;
  string local_98 [32];
  string local_78 [96];
  char *local_18;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 2) {
    pcVar1 = (char *)in_RSI[1];
    local_18 = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    cv::imread(local_78,(int)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) == 0) {
      cv::Mat::Mat(local_110);
      cv::Mat::Mat(local_170);
      detect_rvm(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0);
      draw_objects((Mat *)CONCAT44(in_stack_00000194,argc),(Mat *)argv,(Mat *)imagepath);
      local_4 = 0;
      local_b0 = 1;
      cv::Mat::~Mat(local_170);
      cv::Mat::~Mat(local_110);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",local_18);
      local_4 = -1;
      local_b0 = 1;
    }
    cv::Mat::~Mat((Mat *)local_78);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    cv::Mat fgr, pha;
    detect_rvm(m, pha, fgr);
    draw_objects(m, fgr, pha);

    return 0;
}